

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

bool __thiscall QAuthenticator::operator==(QAuthenticator *this,QAuthenticator *other)

{
  QAuthenticatorPrivate *pQVar1;
  QAuthenticatorPrivate *pQVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  
  pQVar1 = this->d;
  pQVar2 = other->d;
  if (pQVar1 == pQVar2) {
    bVar5 = true;
  }
  else {
    if ((pQVar2 != (QAuthenticatorPrivate *)0x0 && pQVar1 != (QAuthenticatorPrivate *)0x0) &&
       (lVar3 = (pQVar1->user).d.size, lVar3 == (pQVar2->user).d.size)) {
      QVar6.m_data = (pQVar1->user).d.ptr;
      QVar6.m_size = lVar3;
      QVar9.m_data = (pQVar2->user).d.ptr;
      QVar9.m_size = lVar3;
      cVar4 = QtPrivate::equalStrings(QVar6,QVar9);
      if ((cVar4 != '\0') && (lVar3 = (pQVar1->password).d.size, lVar3 == (pQVar2->password).d.size)
         ) {
        QVar7.m_data = (pQVar1->password).d.ptr;
        QVar7.m_size = lVar3;
        QVar10.m_data = (pQVar2->password).d.ptr;
        QVar10.m_size = lVar3;
        cVar4 = QtPrivate::equalStrings(QVar7,QVar10);
        if ((cVar4 != '\0') && (lVar3 = (pQVar1->realm).d.size, lVar3 == (pQVar2->realm).d.size)) {
          QVar8.m_data = (pQVar1->realm).d.ptr;
          QVar8.m_size = lVar3;
          QVar11.m_data = (pQVar2->realm).d.ptr;
          QVar11.m_size = lVar3;
          cVar4 = QtPrivate::equalStrings(QVar8,QVar11);
          if ((cVar4 != '\0') && (pQVar1->method == pQVar2->method)) {
            bVar5 = comparesEqual<QString,_QVariant,_true>(&pQVar1->options,&pQVar2->options);
            return bVar5;
          }
        }
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool QAuthenticator::operator==(const QAuthenticator &other) const
{
    if (d == other.d)
        return true;
    if (!d || !other.d)
        return false;
    return d->user == other.d->user
        && d->password == other.d->password
        && d->realm == other.d->realm
        && d->method == other.d->method
        && d->options == other.d->options;
}